

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

uint cs_system_impl::parse_mode(string *modeString)

{
  int iVar1;
  long lVar2;
  char *p;
  uint mode;
  char *perm;
  char *local_20;
  uint local_14;
  
  local_20 = (char *)std::__cxx11::string::c_str();
  local_14 = 0;
  iVar1 = isdigit((int)*local_20);
  if (iVar1 == 0) {
    lVar2 = std::__cxx11::string::size();
    if (lVar2 == 9) {
      local_14 = ((uint)(*local_20 == 'r') << 2 | (uint)(local_20[1] == 'w') << 1 |
                 (uint)(local_20[2] == 'x')) << 6 |
                 ((uint)(local_20[3] == 'r') << 2 | (uint)(local_20[4] == 'w') << 1 |
                 (uint)(local_20[5] == 'x')) << 3 |
                 (uint)(local_20[6] == 'r') << 2 | (uint)(local_20[7] == 'w') << 1 |
                 (uint)(local_20[8] == 'x');
    }
  }
  else {
    for (; *local_20 != '\0'; local_20 = local_20 + 1) {
      local_14 = (local_14 * 8 + (int)*local_20) - 0x30;
    }
  }
  return local_14;
}

Assistant:

unsigned int parse_mode(const std::string &modeString)
	{
		const char *perm = modeString.c_str();
		unsigned int mode = 0;

		if (std::isdigit(perm[0])) {
			const char *p = perm;
			while (*p) {
				mode = mode * 8 + *p++ - '0';
			}
		}
		else {
			if (modeString.size() == 9) {
				mode = (((perm[0] == 'r') * 4 | (perm[1] == 'w') * 2 | (perm[2] == 'x')) << 6) |
				       (((perm[3] == 'r') * 4 | (perm[4] == 'w') * 2 | (perm[5] == 'x')) << 3) |
				       (((perm[6] == 'r') * 4 | (perm[7] == 'w') * 2 | (perm[8] == 'x')));
			}
		}
		return mode;
	}